

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeList.h
# Opt level: O2

void __thiscall
Refal2::CNodeList<Refal2::COperation>::Detach
          (CNodeList<Refal2::COperation> *this,CNodeType *fromNode,CNodeType *toNode)

{
  CNode<Refal2::COperation> *pCVar1;
  CNode<Refal2::COperation> *pCVar2;
  
  if ((fromNode != (CNodeType *)0x0) && (toNode != (CNodeType *)0x0)) {
    pCVar1 = fromNode->prev;
    pCVar2 = toNode->next;
    if (pCVar1 != (CNode<Refal2::COperation> *)0x0) {
      pCVar1->next = pCVar2;
    }
    if (pCVar2 != (CNode<Refal2::COperation> *)0x0) {
      pCVar2->prev = pCVar1;
    }
    if (this->first == fromNode) {
      this->first = pCVar2;
    }
    if (this->last == toNode) {
      this->last = fromNode->prev;
    }
    fromNode->prev = (CNode<Refal2::COperation> *)0x0;
    toNode->next = (CNode<Refal2::COperation> *)0x0;
    return;
  }
  __assert_fail("fromNode != nullptr && toNode != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/NodeList.h"
                ,0xf7,
                "void Refal2::CNodeList<Refal2::COperation>::Detach(CNodeType *, CNodeType *) [T = Refal2::COperation]"
               );
}

Assistant:

void CNodeList<T>::Detach( CNodeType* fromNode, CNodeType* toNode )
{
	assert( fromNode != nullptr && toNode != nullptr );
	if( fromNode->prev != nullptr ) {
		fromNode->prev->next = toNode->next;
	}
	if( toNode->next != nullptr ) {
		toNode->next->prev = fromNode->prev;
	}
	if( fromNode == first ) {
		first = toNode->next;
	}
	if( toNode == last ) {
		last = fromNode->prev;
	}
	fromNode->prev = nullptr;
	toNode->next = nullptr;
}